

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadstorage.cpp
# Opt level: O1

void __thiscall
QThreadStorageData::QThreadStorageData(QThreadStorageData *this,_func_void_void_ptr *func)

{
  long i;
  QBasicMutex copy;
  QPodArrayOps<void(*)(void*)> *this_00;
  QThreadData *pQVar1;
  pointer pp_Var2;
  QBasicMutex *this_01;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  _func_void_void_ptr *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((AtomicType)destructorsMutex.d_ptr._q_value._M_b._M_p == (AtomicType)0x0) {
    LOCK();
    destructorsMutex.d_ptr._q_value._M_b._M_p = (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x1;
    UNLOCK();
    this_01 = (QBasicMutex *)this;
  }
  else {
    this_01 = &destructorsMutex;
    QBasicMutex::lockInternal(&destructorsMutex);
  }
  this_00 = (QPodArrayOps<void(*)(void*)> *)
            QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_destructors>_>::
            operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_destructors>_>
                        *)this_01);
  if (this_00 == (QPodArrayOps<void(*)(void*)> *)0x0) {
    pQVar1 = QThreadData::currentThreadData();
    if (pQVar1 == (QThreadData *)0x0) {
      pQVar1 = QThreadData::createCurrentThreadData();
    }
    this->id = (int)(pQVar1->tls).d.size;
  }
  else {
    i = *(long *)(this_00 + 0x10);
    if (i == 0) {
      lVar4 = 0;
    }
    else {
      lVar3 = 0;
      do {
        lVar4 = lVar3;
        if (*(long *)(*(long *)(this_00 + 8) + lVar3 * 8) == 0) break;
        lVar3 = lVar3 + 1;
        lVar4 = i;
      } while (i != lVar3);
    }
    this->id = (int)lVar4;
    if (i == lVar4) {
      local_30 = func;
      QtPrivate::QPodArrayOps<void(*)(void*)>::emplace<void(*&)(void*)>(this_00,i,&local_30);
      QList<void_(*)(void_*)>::end((QList<void_(*)(void_*)> *)this_00);
    }
    else {
      pp_Var2 = QList<void_(*)(void_*)>::data((QList<void_(*)(void_*)> *)this_00);
      pp_Var2[lVar4] = func;
    }
  }
  copy.d_ptr._q_value._M_b._M_p = destructorsMutex.d_ptr._q_value._M_b._M_p;
  LOCK();
  destructorsMutex.d_ptr._q_value._M_b._M_p = (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x0;
  UNLOCK();
  if ((AtomicType)copy.d_ptr._q_value._M_b._M_p != (AtomicType)0x1) {
    QBasicMutex::unlockInternalFutex(&destructorsMutex,(void *)copy.d_ptr._q_value._M_b._M_p);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QThreadStorageData::QThreadStorageData(void (*func)(void *))
{
    QMutexLocker locker(&destructorsMutex);
    DestructorMap *destr = destructors();
    if (!destr) {
        /*
         the destructors vector has already been destroyed, yet a new
         QThreadStorage is being allocated. this can only happen during global
         destruction, at which point we assume that there is only one thread.
         in order to keep QThreadStorage working, we need somewhere to store
         the data, best place we have in this situation is at the tail of the
         current thread's tls vector. the destructor is ignored, since we have
         no where to store it, and no way to actually call it.
         */
        QThreadData *data = QThreadData::current();
        id = data->tls.size();
        DEBUG_MSG("QThreadStorageData: Allocated id %d, destructor %p cannot be stored", id, func);
        return;
    }
    for (id = 0; id < destr->size(); id++) {
        if (destr->at(id) == nullptr)
            break;
    }
    if (id == destr->size()) {
        destr->append(func);
    } else {
        (*destr)[id] = func;
    }
    DEBUG_MSG("QThreadStorageData: Allocated id %d, destructor %p", id, func);
}